

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

void __thiscall expr_tree::pwrSimplifs(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *this_00;
  bool bVar2;
  
  bVar2 = IsZero(node->right);
  if (bVar2) {
    peVar1 = node->left;
    if (peVar1 != (expr_node *)0x0) {
      expr_node::~expr_node(peVar1);
    }
    operator_delete(peVar1,0x28);
    peVar1 = node->right;
    if (peVar1 != (expr_node *)0x0) {
      expr_node::~expr_node(peVar1);
    }
    operator_delete(peVar1,0x28);
    node->left = (expr_node *)0x0;
    node->right = (expr_node *)0x0;
    node->type = '\x01';
    (node->value).integer = 1;
  }
  else {
    bVar2 = IsOne(node->right);
    if (bVar2) {
      peVar1 = node->left;
      this_00 = node->right;
      if (this_00 != (expr_node *)0x0) {
        expr_node::~expr_node(this_00);
      }
      operator_delete(this_00,0x28);
      node->type = peVar1->type;
      node->value = peVar1->value;
      Link(node,peVar1->left,peVar1->right);
      peVar1->left = (expr_node *)0x0;
      peVar1->right = (expr_node *)0x0;
      expr_node::~expr_node(peVar1);
      operator_delete(peVar1,0x28);
      return;
    }
  }
  return;
}

Assistant:

void expr_tree::pwrSimplifs(expr_node* node)
{
    if (IsZero(node->right)) {
        delete node->left;
        delete node->right;
        node->left = node->right = nullptr;
        node->type = INT;
        node->value.integer = 1;
    } else if (IsOne(node->right)) {
        expr_node* tmp = node->left;
        delete node->right;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    }
}